

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirDEVICE(void)

{
  bool bVar1;
  int iVar2;
  char *const_id;
  EStatus type;
  aint ramtop_00;
  char *message;
  aint ramtop;
  aint local_1c;
  
  if (deviceDirectivesCount == 0) {
    if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_start ==
        sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      deviceDirectivesCount = deviceDirectivesCount + 1;
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                    ,0x84e,"void dirDEVICE()");
    }
    globalDeviceSourcePos.colEnd =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].colEnd;
    globalDeviceSourcePos.filename =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].filename;
    globalDeviceSourcePos.line =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].line;
    globalDeviceSourcePos.colBegin =
         sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].colBegin;
  }
  deviceDirectivesCount = deviceDirectivesCount + 1;
  const_id = GetID(&lp);
  if (const_id == (char *)0x0) {
    Error("[DEVICE] Syntax error in <deviceid>",lp,SUPPRESS);
    return;
  }
  local_1c = 0;
  bVar1 = anyComma(&lp);
  ramtop_00 = 0;
  if (bVar1) {
    iVar2 = ParseExpressionNoSyntaxError(&lp,&local_1c);
    if (iVar2 == 0) {
      message = "[DEVICE] Syntax error";
      type = PASS3;
      const_id = bp;
      goto LAB_0011180e;
    }
    ramtop_00 = local_1c;
    if (local_1c - 0x10000U < 0xffff5d00) {
      ErrorInt("[DEVICE] valid range for RAMTOP is $5D00..$FFFF",local_1c,PASS3);
      return;
    }
  }
  if ((deviceDirectivesCount < 2) && (Devices != (CDevice *)0x0)) {
    return;
  }
  bVar1 = SetDevice(const_id,ramtop_00);
  if (bVar1) {
    return;
  }
  message = "[DEVICE] Invalid parameter";
  type = IF_FIRST;
LAB_0011180e:
  Error(message,const_id,type);
  return;
}

Assistant:

static void dirDEVICE() {
	// refresh source position of first DEVICE directive
	if (1 == ++deviceDirectivesCount) {
		assert(!sourcePosStack.empty());
		globalDeviceSourcePos = sourcePosStack.back();
	}

	char* id = GetID(lp);
	if (id) {
		aint ramtop = 0;
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, ramtop)) {
				Error("[DEVICE] Syntax error", bp); return;
			}
			if (ramtop < 0x5D00 || 0xFFFF < ramtop) {
			  	ErrorInt("[DEVICE] valid range for RAMTOP is $5D00..$FFFF", ramtop); return;
			}
		}
		// if (1 == deviceDirectivesCount && Device) -> device was already set globally, skip SetDevice
		if (1 < deviceDirectivesCount || !Devices) {
			if (!SetDevice(id, ramtop)) {
				Error("[DEVICE] Invalid parameter", id, IF_FIRST);
			}
		}
	} else {
		Error("[DEVICE] Syntax error in <deviceid>", lp, SUPPRESS);
	}
}